

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswConstr.c
# Opt level: O3

int Ssw_ManSweepConstr(Ssw_Man_t *p)

{
  uint uVar1;
  void **ppvVar2;
  void *pvVar3;
  Vec_Int_t *pVVar4;
  bool bVar5;
  int iVar6;
  Aig_Man_t *pAVar7;
  Aig_Obj_t *pAVar8;
  Bar_Progress_t *p_00;
  Vec_Ptr_t *pVVar9;
  Ssw_Pars_t *pSVar10;
  Aig_Man_t *pAVar11;
  long lVar12;
  Aig_Obj_t *pAVar13;
  uint uVar14;
  Aig_Obj_t *pAVar15;
  int f;
  long lVar16;
  ulong uVar17;
  timespec ts;
  timespec local_40;
  
  iVar6 = clock_gettime(3,&local_40);
  if (iVar6 < 0) {
    lVar12 = 1;
  }
  else {
    lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  pAVar7 = Ssw_FramesWithClasses(p);
  p->pFrames = pAVar7;
  pAVar11 = p->pAig;
  iVar6 = pAVar11->nRegs;
  uVar14 = pAVar7->nObjs[3] - iVar6;
  if ((uVar14 & 1) != 0) {
    __assert_fail("(nConstrPairs & 1) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswConstr.c"
                  ,0x279,"int Ssw_ManSweepConstr(Ssw_Man_t *)");
  }
  if (0 < (int)uVar14) {
    lVar16 = 0;
    do {
      pVVar9 = p->pFrames->vCos;
      uVar1 = pVVar9->nSize;
      if (((int)uVar1 <= lVar16) || ((ulong)uVar1 <= lVar16 + 1U)) goto LAB_005e7978;
      ppvVar2 = pVVar9->pArray;
      Ssw_NodesAreConstrained
                (p,*(Aig_Obj_t **)((long)ppvVar2[lVar16] + 8),
                 *(Aig_Obj_t **)((long)ppvVar2[lVar16 + 1] + 8));
      lVar16 = lVar16 + 2;
    } while ((int)lVar16 < (int)uVar14);
    pAVar11 = p->pAig;
    iVar6 = pAVar11->nRegs;
  }
  if (0 < iVar6) {
    uVar17 = (ulong)uVar14;
    lVar16 = 0;
    do {
      if (((int)uVar17 < 0) || (pVVar9 = p->pFrames->vCos, pVVar9->nSize <= (int)uVar17))
      goto LAB_005e7978;
      Ssw_CnfNodeAddToSolver
                (p->pMSat,(Aig_Obj_t *)
                          (*(ulong *)((long)pVVar9->pArray[uVar17] + 8) & 0xfffffffffffffffe));
      lVar16 = lVar16 + 1;
      pAVar11 = p->pAig;
      uVar17 = uVar17 + 1;
    } while (lVar16 < pAVar11->nRegs);
  }
  iVar6 = p->pPars->nFramesK;
  uVar14 = pAVar11->nTruePis * iVar6;
  p->pNodeToFrames[pAVar11->pConst1->Id * p->nFrames + iVar6] = p->pFrames->pConst1;
  pAVar11 = p->pAig;
  if (0 < pAVar11->nTruePis) {
    lVar16 = 0;
    do {
      if (pAVar11->vCis->nSize <= lVar16) {
LAB_005e7978:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar3 = pAVar11->vCis->pArray[lVar16];
      pAVar8 = Aig_ObjCreateCi(p->pFrames);
      pVVar4 = p->vInits;
      if (pVVar4 == (Vec_Int_t *)0x0) {
        uVar17 = 0;
      }
      else {
        if (((int)uVar14 < 0) || (pVVar4->nSize <= (int)uVar14)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar17 = (ulong)uVar14;
        uVar14 = uVar14 + 1;
        uVar17 = (ulong)(pVVar4->pArray[uVar17] != 0) << 3;
      }
      *(ulong *)&pAVar8->field_0x18 = *(ulong *)&pAVar8->field_0x18 & 0xfffffffffffffff7 | uVar17;
      p->pNodeToFrames[*(int *)((long)pvVar3 + 0x24) * p->nFrames + iVar6] = pAVar8;
      lVar16 = lVar16 + 1;
      pAVar11 = p->pAig;
    } while (lVar16 < pAVar11->nTruePis);
  }
  if (p->vInits->nSize != uVar14) {
    __assert_fail("Vec_IntSize(p->vInits) == iLits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswConstr.c"
                  ,0x292,"int Ssw_ManSweepConstr(Ssw_Man_t *)");
  }
  iVar6 = clock_gettime(3,&local_40);
  if (iVar6 < 0) {
    lVar16 = -1;
  }
  else {
    lVar16 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  p->timeReduce = p->timeReduce + lVar16 + lVar12;
  pSVar10 = p->pPars;
  iVar6 = pSVar10->nFramesK;
  if (-1 < iVar6) {
    pAVar11 = p->pAig;
    f = 0;
    do {
      uVar17 = (ulong)(uint)pAVar11->nTruePos;
      if (0 < pAVar11->nTruePos) {
        lVar12 = 0;
        do {
          if (pAVar11->vCos->nSize <= lVar12) goto LAB_005e7978;
          if ((long)(int)uVar17 - (long)pAVar11->nConstrs <= lVar12) {
            pvVar3 = pAVar11->vCos->pArray[lVar12];
            Ssw_FramesWithClasses_rec
                      (p,(Aig_Obj_t *)(*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe),f);
            if (((ulong)pvVar3 & 1) != 0) goto LAB_005e7997;
            uVar17 = *(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe;
            if (uVar17 == 0) {
              pAVar8 = p->pFrames->pConst1;
              if (pAVar8 != (Aig_Obj_t *)0x1) {
                if (pAVar8 == (Aig_Obj_t *)0x0) goto LAB_005e79b6;
                pAVar8 = (Aig_Obj_t *)((ulong)pAVar8 ^ 1);
                pAVar15 = (Aig_Obj_t *)0x0;
                goto LAB_005e77c2;
              }
            }
            else {
              pAVar15 = (Aig_Obj_t *)
                        ((ulong)((uint)*(ulong *)((long)pvVar3 + 8) & 1) ^
                        (ulong)p->pNodeToFrames[*(int *)(uVar17 + 0x24) * p->nFrames + f]);
              pAVar13 = p->pFrames->pConst1;
              pAVar8 = (Aig_Obj_t *)((ulong)pAVar13 ^ 1);
              if (pAVar15 != pAVar8) {
                if (pAVar13 == pAVar15) {
LAB_005e79b6:
                  __assert_fail("Ssw_ObjChild0Fra(p,pObj,f) != Aig_ManConst1(p->pFrames)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswConstr.c"
                                ,0x2a0,"int Ssw_ManSweepConstr(Ssw_Man_t *)");
                }
LAB_005e77c2:
                Ssw_NodesAreConstrained(p,pAVar15,pAVar8);
              }
            }
          }
          lVar12 = lVar12 + 1;
          pAVar11 = p->pAig;
          uVar17 = (ulong)pAVar11->nTruePos;
        } while (lVar12 < (long)uVar17);
        pSVar10 = p->pPars;
      }
      iVar6 = pSVar10->nFramesK;
      bVar5 = f < iVar6;
      f = f + 1;
    } while (bVar5);
  }
  sat_solver_simplify(p->pMSat->pSat);
  p->fRefined = 0;
  Ssw_ClassesClearRefined(p->ppClasses);
  if (p->pPars->fVerbose == 0) {
    p_00 = (Bar_Progress_t *)0x0;
  }
  else {
    p_00 = Bar_ProgressStart(_stdout,p->pAig->vObjs->nSize);
  }
  pVVar9 = p->pAig->vObjs;
  if (0 < pVVar9->nSize) {
    lVar12 = 0;
    do {
      pAVar8 = (Aig_Obj_t *)pVVar9->pArray[lVar12];
      if (pAVar8 != (Aig_Obj_t *)0x0) {
        if ((p->pPars->fVerbose != 0) &&
           ((p_00 == (Bar_Progress_t *)0x0 || (p_00->nItemsNext <= lVar12)))) {
          Bar_ProgressUpdate_int(p_00,(int)lVar12,(char *)0x0);
        }
        uVar14 = (uint)*(undefined8 *)&pAVar8->field_0x18;
        if (((uVar14 & 7) != 2) || (pAVar11 = p->pAig, (pAVar8->field_0).CioId < pAVar11->nTruePis))
        {
          if ((uVar14 & 7) - 7 < 0xfffffffe) goto LAB_005e793d;
          if (((ulong)pAVar8 & 1) != 0) {
LAB_005e7997:
            __assert_fail("!Aig_IsComplement(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswInt.h"
                          ,0xb9,"Aig_Obj_t *Ssw_ObjChild0Fra(Ssw_Man_t *, Aig_Obj_t *, int)");
          }
          uVar17 = (ulong)pAVar8->pFanin0 & 0xfffffffffffffffe;
          if (uVar17 == 0) {
            pAVar15 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar15 = (Aig_Obj_t *)
                      ((ulong)((uint)pAVar8->pFanin0 & 1) ^
                      (ulong)p->pNodeToFrames[*(int *)(uVar17 + 0x24) * p->nFrames + iVar6]);
          }
          uVar17 = (ulong)pAVar8->pFanin1 & 0xfffffffffffffffe;
          if (uVar17 == 0) {
            pAVar13 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar13 = (Aig_Obj_t *)
                      ((ulong)((uint)pAVar8->pFanin1 & 1) ^
                      (ulong)p->pNodeToFrames[*(int *)(uVar17 + 0x24) * p->nFrames + iVar6]);
          }
          pAVar15 = Aig_And(p->pFrames,pAVar15,pAVar13);
          pAVar11 = (Aig_Man_t *)(long)(pAVar8->Id * p->nFrames + iVar6);
          p->pNodeToFrames[(long)pAVar11] = pAVar15;
        }
        uVar14 = Ssw_ManSweepNodeConstr(p,pAVar8,iVar6,(int)pAVar11);
        p->fRefined = p->fRefined | uVar14;
      }
LAB_005e793d:
      lVar12 = lVar12 + 1;
      pVVar9 = p->pAig->vObjs;
    } while (lVar12 < pVVar9->nSize);
  }
  if (p->pPars->fVerbose != 0) {
    Bar_ProgressStop(p_00);
  }
  return p->fRefined;
}

Assistant:

int Ssw_ManSweepConstr( Ssw_Man_t * p )
{
    Bar_Progress_t * pProgress = NULL;
    Aig_Obj_t * pObj, * pObj2, * pObjNew;
    int nConstrPairs, i, f, iLits;
    abctime clk;
//Ssw_ManPrintPolarity( p->pAig );

    // perform speculative reduction
clk = Abc_Clock();
    // create timeframes
    p->pFrames = Ssw_FramesWithClasses( p );
    // add constants
    nConstrPairs = Aig_ManCoNum(p->pFrames)-Aig_ManRegNum(p->pAig);
    assert( (nConstrPairs & 1) == 0 );
    for ( i = 0; i < nConstrPairs; i += 2 )
    {
        pObj  = Aig_ManCo( p->pFrames, i   );
        pObj2 = Aig_ManCo( p->pFrames, i+1 );
        Ssw_NodesAreConstrained( p, Aig_ObjChild0(pObj), Aig_ObjChild0(pObj2) );
    }
    // build logic cones for register inputs
    for ( i = 0; i < Aig_ManRegNum(p->pAig); i++ )
    {
        pObj  = Aig_ManCo( p->pFrames, nConstrPairs + i );
        Ssw_CnfNodeAddToSolver( p->pMSat, Aig_ObjFanin0(pObj) );//
    }

    // map constants and PIs of the last frame
    f = p->pPars->nFramesK;
//    iLits = 0;
    iLits = f * Saig_ManPiNum(p->pAig);
    Ssw_ObjSetFrame( p, Aig_ManConst1(p->pAig), f, Aig_ManConst1(p->pFrames) );
    Saig_ManForEachPi( p->pAig, pObj, i )
    {
        pObjNew = Aig_ObjCreateCi(p->pFrames);
        pObjNew->fPhase = (p->vInits != NULL) && Vec_IntEntry(p->vInits, iLits++);
        Ssw_ObjSetFrame( p, pObj, f, pObjNew );
    }
    assert( Vec_IntSize(p->vInits) == iLits );
p->timeReduce += Abc_Clock() - clk;

    // add constraints to all timeframes
    for ( f = 0; f <= p->pPars->nFramesK; f++ )
    {
        Saig_ManForEachPo( p->pAig, pObj, i )
        {
            if ( i < Saig_ManPoNum(p->pAig) - Saig_ManConstrNum(p->pAig) )
                continue;
            Ssw_FramesWithClasses_rec( p, Aig_ObjFanin0(pObj), f );
//            if ( Aig_Regular(Ssw_ObjChild0Fra(p,pObj,f)) == Aig_ManConst1(p->pFrames) )
            if ( Ssw_ObjChild0Fra(p,pObj,f) == Aig_ManConst0(p->pFrames) )
                continue;
            assert( Ssw_ObjChild0Fra(p,pObj,f) != Aig_ManConst1(p->pFrames) );
            if ( Ssw_ObjChild0Fra(p,pObj,f) == Aig_ManConst1(p->pFrames) )
            {
                Abc_Print( 1, "Polarity violation.\n" );
                continue;
            }
            Ssw_NodesAreConstrained( p, Ssw_ObjChild0Fra(p,pObj,f), Aig_ManConst0(p->pFrames) );
        }
    }
    f = p->pPars->nFramesK;
    // clean the solver
    sat_solver_simplify( p->pMSat->pSat );


    // sweep internal nodes
    p->fRefined = 0;
    Ssw_ClassesClearRefined( p->ppClasses );
    if ( p->pPars->fVerbose )
        pProgress = Bar_ProgressStart( stdout, Aig_ManObjNumMax(p->pAig) );
    Aig_ManForEachObj( p->pAig, pObj, i )
    {
        if ( p->pPars->fVerbose )
            Bar_ProgressUpdate( pProgress, i, NULL );
        if ( Saig_ObjIsLo(p->pAig, pObj) )
            p->fRefined |= Ssw_ManSweepNodeConstr( p, pObj, f, 0 );
        else if ( Aig_ObjIsNode(pObj) )
        {
            pObjNew = Aig_And( p->pFrames, Ssw_ObjChild0Fra(p, pObj, f), Ssw_ObjChild1Fra(p, pObj, f) );
            Ssw_ObjSetFrame( p, pObj, f, pObjNew );
            p->fRefined |= Ssw_ManSweepNodeConstr( p, pObj, f, 0 );
        }
    }
    if ( p->pPars->fVerbose )
        Bar_ProgressStop( pProgress );
    // cleanup
//    Ssw_ClassesCheck( p->ppClasses );
    return p->fRefined;
}